

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

PrefixRange __thiscall
Potassco::ProgramOptions::OptionContext::findImpl
          (OptionContext *this,char *key,FindType t,uint eMask,string *eCtx)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  char *pcVar4;
  undefined1 *puVar5;
  string *ctx;
  undefined8 uVar6;
  pointer ppVar7;
  string *psVar8;
  uint in_ECX;
  uint in_EDX;
  string *in_RSI;
  UnknownOption *in_RDI;
  string str;
  index_iterator up;
  index_iterator it;
  string k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  in_stack_fffffffffffffec8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string *ctx_00;
  string local_d8 [32];
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  _Base_ptr local_88;
  _Self local_80;
  _Self local_78;
  _Self local_70 [3];
  string local_51;
  uint local_28;
  uint local_24;
  PrefixRange local_10;
  
  if (in_RSI == (string *)0x0) {
    in_RSI = (string *)0x1454a5;
  }
  psVar8 = &local_51;
  ctx_00 = in_RSI;
  local_28 = in_ECX;
  local_24 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_51.field_0x1,(char *)in_RSI,(allocator *)psVar8);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (((local_24 == 4) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_51.field_0x1), *pcVar4 != '-')
     ) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_51.field_0x1);
    std::__cxx11::string::operator+=((string *)&local_51.field_0x1,*pcVar4);
    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&local_51.field_0x1);
    *puVar5 = 0x2d;
  }
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::lower_bound(in_stack_fffffffffffffeb8,(key_type *)0x12af32);
  local_70[0]._M_node = local_78._M_node;
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(in_stack_fffffffffffffeb8);
  bVar1 = std::operator!=(local_70,&local_80);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                  *)0x12af93);
    _Var2 = std::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if ((_Var2) && ((local_24 & 5) != 0)) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                    *)in_stack_fffffffffffffec0);
    }
    else if ((local_24 & 2) != 0) {
      std::__cxx11::string::operator+=((string *)&local_51.field_0x1,'\x7f');
      local_88 = (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::upper_bound(in_stack_fffffffffffffeb8,(key_type *)0x12b003);
      in_stack_fffffffffffffed0._M_node = (_Base_ptr)&local_51.field_0x1;
      local_78._M_node = local_88;
      local_a0 = std::__cxx11::string::end();
      local_98 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffffec8._M_node,
                                     (difference_type)in_stack_fffffffffffffec0);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffec0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffeb8);
      local_a8 = std::__cxx11::string::erase(in_stack_fffffffffffffed0._M_node,local_90);
    }
  }
  local_b0 = local_70[0]._M_node;
  local_b8 = local_78._M_node;
  ctx = (string *)
        std::
        distance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if ((ctx != (string *)0x1) && (local_28 != 0)) {
    if (((local_28 & 1) != 0) && (bVar1 = std::operator==(local_70,&local_78), bVar1)) {
      uVar6 = __cxa_allocate_exception(0x58);
      UnknownOption::UnknownOption(in_RDI,ctx_00,psVar8);
      __cxa_throw(uVar6,&UnknownOption::typeinfo,UnknownOption::~UnknownOption);
    }
    if (((local_28 & 2) != 0) && (bVar1 = std::operator!=(local_70,&local_78), bVar1)) {
      std::__cxx11::string::string(local_d8);
      while (bVar1 = std::operator!=(local_70,&local_78), bVar1) {
        std::__cxx11::string::operator+=(local_d8,"  ");
        ppVar7 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                               *)0x12b203);
        std::__cxx11::string::operator+=(local_d8,(string *)ppVar7);
        std::__cxx11::string::operator+=(local_d8,"\n");
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                      *)in_stack_fffffffffffffec0);
      }
      psVar8 = (string *)__cxa_allocate_exception(0x58);
      AmbiguousOption::AmbiguousOption
                ((AmbiguousOption *)in_stack_fffffffffffffed0._M_node,ctx,in_stack_fffffffffffffec0,
                 psVar8);
      __cxa_throw(psVar8,&AmbiguousOption::typeinfo,AmbiguousOption::~AmbiguousOption);
    }
  }
  std::
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_&,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_&,_true>
            (&local_10,local_70,&local_78);
  std::__cxx11::string::~string((string *)&local_51.field_0x1);
  return local_10;
}

Assistant:

OptionContext::PrefixRange OptionContext::findImpl(const char* key, FindType t, unsigned eMask, const std::string& eCtx) const {
	std::string k(key ? key : "");
	if (t == find_alias && !k.empty() && k[0] != '-') {
		k += k[0];
		k[0] = '-';
	}
	index_iterator it = index_.lower_bound(k);
	index_iterator up = it;
	if (it != index_.end()) {
		if ((it->first == k) && ((t & (find_alias|find_name)) != 0)) {
			++up;
		}
		else if ((t & find_prefix) != 0) {
			k += char(CHAR_MAX);
			up = index_.upper_bound(k);
			k.erase(k.end()-1);
		}
	}
	if (std::distance(it, up) != 1 && eMask) {
		if ((eMask & 1u) && it == up) { throw UnknownOption(eCtx, k); }
		if ((eMask & 2u) && it != up) {
			std::string str;
			for (; it != up; ++it) {
				str += "  ";
				str += it->first;
				str += "\n";
			}
			throw AmbiguousOption(eCtx, k, str);
		}
	}
	return PrefixRange(it, up);
}